

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

uint __thiscall
Strings::VerySimpleReadOnlyString::reverseFind
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *needle,uint pos)

{
  uint local_2c;
  uint local_28;
  uint j;
  uint i;
  uint pos_local;
  VerySimpleReadOnlyString *needle_local;
  VerySimpleReadOnlyString *this_local;
  
  if (this->length < needle->length) {
    this_local._4_4_ = this->length;
  }
  else {
    local_28 = min<unsigned_int>(pos,this->length - needle->length);
    local_2c = 0;
    do {
      while (needle->data[local_2c] != this->data[local_28 + local_2c]) {
        if (local_28 == 0) {
          return this->length;
        }
        local_28 = local_28 - 1;
        local_2c = 0;
      }
      local_2c = local_2c + 1;
    } while (local_2c < (uint)needle->length);
    this_local._4_4_ = local_28;
  }
  return this_local._4_4_;
}

Assistant:

const unsigned int VerySimpleReadOnlyString::reverseFind(const VerySimpleReadOnlyString & needle, unsigned int pos) const
    {
        if (needle.length > length) return length;
        unsigned int i = min(pos, (unsigned int)(length - needle.length)); // If there is no space to find out the needle at the end, simply snap back
	    for (unsigned int j = 0;;)
	    {
		    if (needle.data[j] == data[i + j])
		    {
			    j ++;
			    if (j >= (unsigned int)needle.length) return i;
		    } else
		    {
			    if (i-- == 0) break;
			    j = 0;
		    }
	    }
        return length;
    }